

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.hpp
# Opt level: O1

string_t duckdb::FSSTPrimitives::DecompressValue
                   (void *duckdb_fsst_decoder,VectorStringBuffer *str_buffer,char *compressed_string
                   ,idx_t compressed_string_len)

{
  idx_t len;
  data_ptr_t output;
  size_t str_len;
  anon_union_16_2_67f50693_for_value aVar1;
  
  len = compressed_string_len * 8;
  output = ArenaAllocator::Allocate(&(str_buffer->heap).allocator,len);
  str_len = duckdb_fsst_decompress
                      ((duckdb_fsst_decoder_t *)duckdb_fsst_decoder,compressed_string_len,
                       (uchar *)compressed_string,len,output);
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       VectorStringBuffer::FinalizeShrinkableBuffer(str_buffer,output,len,str_len);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static string_t DecompressValue(void *duckdb_fsst_decoder, VectorStringBuffer &str_buffer,
	                                const char *compressed_string, const idx_t compressed_string_len) {
		const auto max_uncompressed_length = compressed_string_len * 8;
		const auto fsst_decoder = static_cast<duckdb_fsst_decoder_t *>(duckdb_fsst_decoder);
		const auto compressed_string_ptr = (const unsigned char *)compressed_string; // NOLINT
		const auto target_ptr = str_buffer.AllocateShrinkableBuffer(max_uncompressed_length);
		const auto decompressed_string_size = duckdb_fsst_decompress(
		    fsst_decoder, compressed_string_len, compressed_string_ptr, max_uncompressed_length, target_ptr);
		return str_buffer.FinalizeShrinkableBuffer(target_ptr, max_uncompressed_length, decompressed_string_size);
	}